

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_dwl(int *ip)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char c;
  int *ip_local;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 1;
  data_level = 2;
  do {
    iVar3 = evaluate(ip,'\0');
    iVar2 = loccnt;
    if (iVar3 == 0) {
      return;
    }
    loccnt = loccnt + 1;
    if (pass == 1) {
      if ((0xffff < value) && (value < 0xffff8000)) {
        error("Overflow error!");
        return;
      }
      putbyte(iVar2,value & 0xff);
    }
    iVar2 = *ip;
    *ip = iVar2 + 1;
    cVar1 = prlnbuf[iVar2];
    if (cVar1 != ',') {
      if ((cVar1 == ';') || (cVar1 == '\0')) {
        if (lablptr == (t_symbol *)0x0) {
          if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 0)) {
            lastlabl->data_size = (loccnt - data_loccnt) + lastlabl->data_size;
          }
        }
        else {
          lablptr->data_type = 0;
          lablptr->data_size = loccnt - data_loccnt;
        }
        if (pass == 1) {
          println();
        }
      }
      else {
        error("Syntax error!");
      }
      return;
    }
  } while( true );
}

Assistant:

void
do_dwl(int *ip)
{
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 1;
	data_level  = 2;

	/* get data */
	for (;;) {
		/* get a word */
		if (!evaluate(ip, 0))
			return;

		/* update location counter */
		loccnt += 1;

		/* store word on last pass */
		if (pass == LAST_PASS) {
			/* check for overflow */
			if ((value > 0xFFFF) && (value < 0xFFFF8000)) {
				error("Overflow error!");
				return;
			}

			/* store word */
			putbyte(loccnt - 1, (value & 0xff));
		}

		/* check if there's another word */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* check error */
	if (c != ';' && c != '\0') {
		error("Syntax error!");
		return;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_DB;
		lablptr->data_size = loccnt - data_loccnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_DB)
				lastlabl->data_size += loccnt - data_loccnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();
}